

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

tc_toktyp_t __thiscall
CTcTokenizer::xlat_string_to_src(CTcTokenizer *this,tok_embed_ctx *ec,int force_embed_end)

{
  tc_toktyp_t tVar1;
  long lVar2;
  
  reserve_source(this,(size_t)(this->curbuf_->buf_ + (this->curbuf_->buf_len_ - (long)(this->p_).p_)
                              ));
  tVar1 = xlat_string_to(this,this->src_ptr_,&this->p_,&this->curtok_,ec,force_embed_end);
  lVar2 = (this->curtok_).text_len_ + 1;
  this->src_ptr_ = this->src_ptr_ + lVar2;
  this->src_rem_ = this->src_rem_ - lVar2;
  return tVar1;
}

Assistant:

tc_toktyp_t CTcTokenizer::xlat_string_to_src(
    tok_embed_ctx *ec, int force_embed_end)
{
    /* 
     *   Reserve space for the entire rest of the line.  This is
     *   conservative, in that we will definitely need less space than
     *   this.  This might cause us to waste a little space here and
     *   there, since we will over-allocate when we have a short string
     *   early in a long line, but this will save us the time of scanning
     *   the string twice just to see how long it is. 
     */
    reserve_source(curbuf_->get_text_len() -
                   (p_.getptr() - curbuf_->get_text()));

    /* translate into the source block */
    tc_toktyp_t typ = xlat_string_to(
        src_ptr_, &p_, &curtok_, ec, force_embed_end);

    /* commit the space in the source block */
    commit_source(curtok_.get_text_len() + 1);

    /* return the string token */
    return typ;
}